

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BRDBoard.cpp
# Opt level: O2

void __thiscall BRDBoard::BRDBoard(BRDBoard *this,BRDFileBase *boardFile)

{
  SharedVector<Component> *this_00;
  _Rb_tree_node_base *__x;
  undefined8 uVar1;
  int iVar2;
  pointer ppVar3;
  char *__s;
  pointer psVar4;
  pointer psVar5;
  Point PVar6;
  element_type *peVar7;
  bool bVar8;
  bool bVar9;
  __shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2> *p_Var10;
  size_type sVar11;
  mapped_type *pmVar12;
  _Base_ptr p_Var13;
  long lVar14;
  EBoardSide EVar15;
  long lVar16;
  const_iterator __last;
  int iVar17;
  ulong uVar18;
  element_type *peVar19;
  pointer pBVar20;
  pointer pBVar21;
  pointer ppVar22;
  __shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *p_Var23;
  const_iterator __first;
  __normal_iterator<std::shared_ptr<Component>_*,_std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>_>
  __i;
  pointer psVar24;
  shared_ptr<Pin> pin;
  shared_ptr<Net> net_nc;
  uint local_21c;
  shared_ptr<Net> net_1;
  SharedStringMap<Net> net_map;
  shared_ptr<Component> comp_dummy;
  shared_ptr<Net> net;
  shared_ptr<Component> comp_1;
  string net_name;
  vector<BRDPart,_std::allocator<BRDPart>_> m_parts;
  vector<BRDPoint,_std::allocator<BRDPoint>_> m_points;
  vector<BRDNail,_std::allocator<BRDNail>_> m_nails;
  vector<BRDPin,_std::allocator<BRDPin>_> m_pins;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  (this->super_Board)._vptr_Board = (_func_int **)&PTR__BRDBoard_00202fd8;
  this->m_file = boardFile;
  this_00 = &this->components_;
  (this->nets_).super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->nets_).super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->nets_).super__Vector_base<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->components_).
  super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->components_).
  super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->components_).
  super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->pins_).super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->pins_).super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->pins_).super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->outline_points_).
  super__Vector_base<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->outline_points_).
  super__Vector_base<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->outline_points_).
  super__Vector_base<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (this->outline_segments_).
  super__Vector_base<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (this->outline_segments_).
  super__Vector_base<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->outline_segments_).
  super__Vector_base<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<BRDPart,_std::allocator<BRDPart>_>::vector
            (&m_parts,(ulong)boardFile->num_parts,(allocator_type *)&net_map);
  std::vector<BRDPin,_std::allocator<BRDPin>_>::vector
            (&m_pins,(ulong)this->m_file->num_pins,(allocator_type *)&net_map);
  std::vector<BRDNail,_std::allocator<BRDNail>_>::vector
            (&m_nails,(ulong)this->m_file->num_nails,(allocator_type *)&net_map);
  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::vector
            (&m_points,(ulong)this->m_file->num_format,(allocator_type *)&net_map);
  std::vector<BRDPart,_std::allocator<BRDPart>_>::operator=(&m_parts,&this->m_file->parts);
  std::vector<BRDPin,_std::allocator<BRDPin>_>::operator=(&m_pins,&this->m_file->pins);
  std::vector<BRDNail,_std::allocator<BRDNail>_>::operator=(&m_nails,&this->m_file->nails);
  std::vector<BRDPoint,_std::allocator<BRDPoint>_>::operator=(&m_points,&this->m_file->format);
  for (; m_points.super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
         super__Vector_impl_data._M_start !=
         m_points.super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
         super__Vector_impl_data._M_finish;
      m_points.super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
      super__Vector_impl_data._M_start =
           m_points.super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
           super__Vector_impl_data._M_start + 1) {
    std::make_shared<Point,int&,int&>
              ((int *)&net_map,
               &(m_points.super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>._M_impl.
                 super__Vector_impl_data._M_start)->x);
    std::vector<std::shared_ptr<Point>,_std::allocator<std::shared_ptr<Point>_>_>::push_back
              (&this->outline_points_,(value_type *)&net_map);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
               &net_map._M_t._M_impl.super__Rb_tree_header);
  }
  std::vector<std::pair<Point,_Point>,_std::allocator<std::pair<Point,_Point>_>_>::reserve
            (&this->outline_segments_,
             (long)(this->m_file->outline_segments).
                   super__Vector_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish -
             (long)(this->m_file->outline_segments).
                   super__Vector_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                   ._M_impl.super__Vector_impl_data._M_start >> 4);
  ppVar3 = (this->m_file->outline_segments).
           super__Vector_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (ppVar22 = (this->m_file->outline_segments).
                 super__Vector_base<std::pair<BRDPoint,_BRDPoint>,_std::allocator<std::pair<BRDPoint,_BRDPoint>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; ppVar22 != ppVar3; ppVar22 = ppVar22 + 1
      ) {
    net_map._M_t._M_impl._0_4_ = (BADTYPE)(ppVar22->first).x;
    net_map._M_t._M_impl._4_4_ = (BADTYPE)(ppVar22->first).y;
    net_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color =
         (_Rb_tree_color)(float)(ppVar22->second).x;
    net_map._M_t._M_impl.super__Rb_tree_header._M_header._4_4_ = (BADTYPE)(ppVar22->second).y;
    std::vector<std::pair<Point,Point>,std::allocator<std::pair<Point,Point>>>::
    emplace_back<std::pair<Point,Point>>
              ((vector<std::pair<Point,Point>,std::allocator<std::pair<Point,Point>>> *)
               &this->outline_segments_,(pair<Point,_Point> *)&net_map);
  }
  net_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  net_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  net_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &net_map._M_t._M_impl.super__Rb_tree_header._M_header;
  net_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  net_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       net_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  std::make_shared<Net>();
  std::__cxx11::string::_M_assign
            ((string *)&(net_nc.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name);
  (net_nc.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->is_ground = false;
  p_Var10 = &std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
             ::operator[](&net_map,&(net_nc.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>.
                                    _M_ptr)->name)->
             super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>;
  std::__shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>::operator=
            (p_Var10,&net_nc.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>);
  for (pBVar20 = m_nails.super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pBVar20 !=
      m_nails.super__Vector_base<BRDNail,_std::allocator<BRDNail>_>._M_impl.super__Vector_impl_data.
      _M_finish; pBVar20 = pBVar20 + 1) {
    std::make_shared<Net>();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&net_name,pBVar20->net,(allocator<char> *)&comp_dummy);
    std::__cxx11::string::operator=
              ((string *)&(net.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name,
               (string *)&net_name);
    std::__cxx11::string::~string((string *)&net_name);
    std::__cxx11::string::string((string *)&local_50,(string *)&kNetUnconnectedPrefix_abi_cxx11_);
    std::__cxx11::string::string
              ((string *)&local_70,
               (string *)&(net.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name);
    bVar8 = is_prefix(&local_50,&local_70);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_50);
    if (!bVar8) {
      *(uint *)&((net.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_BoardElement).field_0xc = pBVar20->probe;
      ((net.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_BoardElement).
      board_side = (uint)(pBVar20->side != Top);
      p_Var10 = &std::
                 map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                 ::operator[](&net_map,&(net.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>.
                                        _M_ptr)->name)->
                 super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>;
      std::__shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>::operator=
                (p_Var10,&net.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>);
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&net.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&net_nc.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  for (pBVar21 = m_parts.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.
                 super__Vector_impl_data._M_start;
      pBVar21 !=
      m_parts.super__Vector_base<BRDPart,_std::allocator<BRDPart>_>._M_impl.super__Vector_impl_data.
      _M_finish; pBVar21 = pBVar21 + 1) {
    std::make_shared<Component>();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&net_name,pBVar21->name,(allocator<char> *)&net);
    std::__cxx11::string::operator=
              ((string *)
               &((net_nc.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name).
                _M_string_length,(string *)&net_name);
    std::__cxx11::string::~string((string *)&net_name);
    std::__cxx11::string::operator=
              ((string *)&(net_nc.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->pins,
               (string *)&pBVar21->mfgcode);
    net_nc.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].pins.
    super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>._M_impl.
    super__Vector_impl_data._M_finish =
         (pointer)CONCAT44((float)(pBVar21->p1).y,(float)(pBVar21->p1).x);
    net_nc.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>._M_ptr[1].pins.
    super__Vector_base<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         (pointer)CONCAT44((float)(pBVar21->p2).y,(float)(pBVar21->p2).x);
    std::__cxx11::string::string((string *)&local_90,(string *)&kComponentDummyName_abi_cxx11_);
    std::__cxx11::string::string
              ((string *)&local_b0,
               (string *)
               &((net_nc.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name).
                _M_string_length);
    bVar8 = is_prefix(&local_90,&local_b0);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_90);
    if (bVar8) {
      *(undefined4 *)
       &((net_nc.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name)._M_dataplus._M_p
           = 1;
    }
    EVar15 = (pBVar21->mounting_side != Bottom) + kBoardSideBottom;
    if (pBVar21->mounting_side == Top) {
      EVar15 = kBoardSideTop;
    }
    ((net_nc.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_BoardElement).
    board_side = EVar15;
    *(uint *)&((net_nc.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              super_BoardElement).field_0xc = 2 - (uint)(pBVar21->part_type == SMD);
    std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::push_back
              (this_00,(value_type *)&net_nc);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&net_nc.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::make_shared<Component>();
  std::__cxx11::string::_M_assign
            ((string *)
             &(comp_dummy.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name);
  (comp_dummy.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->component_type =
       kComponentTypeDummy;
  std::vector<BRDPin,_std::allocator<BRDPin>_>::vector
            ((vector<BRDPin,_std::allocator<BRDPin>_> *)&net_nc,&m_pins);
  std::vector<BRDPart,_std::allocator<BRDPart>_>::vector
            ((vector<BRDPart,_std::allocator<BRDPart>_> *)&net,&m_parts);
  iVar17 = 1;
  lVar16 = 0x30;
  local_21c = 0;
  for (uVar18 = 0; peVar7 = net_nc.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>._M_ptr,
      uVar18 < (ulong)(((long)net_nc.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                              ._M_pi -
                       (long)net_nc.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>._M_ptr) /
                      0x38); uVar18 = uVar18 + 1) {
    std::__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
              (&comp_1.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>,
               &(this_00->
                super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
                )._M_impl.super__Vector_impl_data._M_start
                [*(int *)((long)net_nc.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>._M_ptr +
                         lVar16 + -0x24) - 1].
                super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>);
    if (comp_1.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
        (element_type *)0x0) {
      std::make_shared<Pin>();
      bVar8 = (comp_1.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
              component_type == kComponentTypeDummy;
      p_Var23 = &comp_1.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>;
      if (bVar8) {
        p_Var23 = &comp_dummy.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>;
      }
      *(uint *)&((pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                super_BoardElement).field_0xc = bVar8 + 2 + (uint)bVar8;
      std::__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>::operator=
                (&((pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->component).
                  super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>,p_Var23);
      std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::push_back
                (&p_Var23->_M_ptr->pins,&pin);
      local_21c = local_21c + 1;
      iVar2 = *(int *)((long)peVar7 + lVar16 + -0x24);
      if (iVar2 != iVar17) {
        local_21c = 1;
      }
      if (*(long *)((long)peVar7 + lVar16 + -8) == 0) {
        std::__cxx11::to_string(&net_name,local_21c);
        std::__cxx11::string::operator=
                  ((string *)
                   &(pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->number,
                   (string *)&net_name);
        std::__cxx11::string::~string((string *)&net_name);
      }
      else {
        std::__cxx11::string::assign
                  ((char *)&(pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->number
                  );
      }
      __s = *(char **)((long)&(peVar7->super_BoardElement)._vptr_BoardElement + lVar16);
      if (__s == (char *)0x0) {
        std::__cxx11::string::_M_assign
                  ((string *)&(pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name
                  );
      }
      else {
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&net_name,__s,(allocator<char> *)&net_1);
        std::__cxx11::string::operator=
                  ((string *)&(pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name
                   ,(string *)&net_name);
        std::__cxx11::string::~string((string *)&net_name);
      }
      uVar1 = *(undefined8 *)((long)peVar7 + lVar16 + -0x30);
      PVar6.y = (float)(int)((ulong)uVar1 >> 0x20);
      PVar6.x = (float)(int)uVar1;
      (pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->position = PVar6;
      iVar17 = *(int *)((long)peVar7 + lVar16 + -0x20);
      EVar15 = (iVar17 != 1) + kBoardSideBottom;
      if (iVar17 == 2) {
        EVar15 = kBoardSideTop;
      }
      ((pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_BoardElement).
      board_side = EVar15;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&net_name,*(char **)((long)peVar7 + lVar16 + -0x18),
                 (allocator<char> *)&net_1);
      sVar11 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
               ::count(&net_map,&net_name);
      if (sVar11 == 0) {
        if (net_name._M_string_length == 0) {
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                    ::operator[](&net_map,&kNetUnconnectedPrefix_abi_cxx11_);
        }
        else {
          std::__cxx11::string::string
                    ((string *)&local_d0,(string *)&kNetUnconnectedPrefix_abi_cxx11_);
          std::__cxx11::string::string((string *)&local_f0,(string *)&net_name);
          bVar8 = is_prefix(&local_d0,&local_f0);
          std::__cxx11::string::~string((string *)&local_f0);
          std::__cxx11::string::~string((string *)&local_d0);
          if (!bVar8) {
            std::make_shared<Net>();
            std::__cxx11::string::_M_assign
                      ((string *)
                       &(net_1.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->name);
            ((net_1.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_BoardElement)
            .board_side = ((pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                          super_BoardElement).board_side;
            p_Var10 = &std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                       ::operator[](&net_map,&net_name)->
                       super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>;
            std::__shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>::operator=
                      (p_Var10,&net_1.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>);
            (pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->net =
                 net_1.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                      (&net_1.super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
            peVar19 = (pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->net;
            goto LAB_0011da46;
          }
          pmVar12 = std::
                    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                    ::operator[](&net_map,&kNetUnconnectedPrefix_abi_cxx11_);
        }
        peVar19 = (pmVar12->super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        (pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->net = peVar19;
        *(undefined4 *)
         &((pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->super_BoardElement).
          field_0xc = 1;
      }
      else {
        pmVar12 = std::
                  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
                  ::operator[](&net_map,&net_name);
        peVar19 = (pmVar12->super___shared_ptr<Net,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
        (pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->net = peVar19;
      }
LAB_0011da46:
      (pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->diameter =
           (float)*(double *)((long)peVar7 + lVar16 + -0x10);
      std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::push_back
                (&peVar19->pins,&pin);
      std::vector<std::shared_ptr<Pin>,_std::allocator<std::shared_ptr<Pin>_>_>::push_back
                (&this->pins_,&pin);
      std::__cxx11::string::~string((string *)&net_name);
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
                (&pin.super___shared_ptr<Pin,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
      iVar17 = iVar2;
    }
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&comp_1.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
    lVar16 = lVar16 + 0x38;
  }
  p_Var23 = &((this->components_).
              super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
              ._M_impl.super__Vector_impl_data._M_start)->
             super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>;
  __last._M_current =
       (this->components_).
       super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>.
       _M_impl.super__Vector_impl_data._M_finish;
  lVar16 = (long)__last._M_current - (long)p_Var23;
  for (lVar14 = lVar16 >> 6; 0 < lVar14; lVar14 = lVar14 + -1) {
    __first._M_current = (shared_ptr<Component> *)p_Var23;
    if (((__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *)&p_Var23->_M_ptr)->_M_ptr->
        component_type == kComponentTypeDummy) goto LAB_0011db5e;
    if (((__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *)&p_Var23[1]._M_ptr)->_M_ptr->
        component_type == kComponentTypeDummy) {
      __first._M_current = (shared_ptr<Component> *)(p_Var23 + 1);
      goto LAB_0011db5e;
    }
    if (((__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *)&p_Var23[2]._M_ptr)->_M_ptr->
        component_type == kComponentTypeDummy) {
      __first._M_current = (shared_ptr<Component> *)(p_Var23 + 2);
      goto LAB_0011db5e;
    }
    if (((__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *)&p_Var23[3]._M_ptr)->_M_ptr->
        component_type == kComponentTypeDummy) {
      __first._M_current = (shared_ptr<Component> *)(p_Var23 + 3);
      goto LAB_0011db5e;
    }
    p_Var23 = p_Var23 + 4;
    lVar16 = lVar16 + -0x40;
  }
  lVar16 = lVar16 >> 4;
  if (lVar16 == 1) {
LAB_0011db41:
    __first._M_current = (shared_ptr<Component> *)p_Var23;
    if (((__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *)&p_Var23->_M_ptr)->_M_ptr->
        component_type != kComponentTypeDummy) {
      __first._M_current = __last._M_current;
    }
  }
  else if (lVar16 == 2) {
LAB_0011db34:
    __first._M_current = (shared_ptr<Component> *)p_Var23;
    if (((__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *)&p_Var23->_M_ptr)->_M_ptr->
        component_type != kComponentTypeDummy) {
      p_Var23 = p_Var23 + 1;
      goto LAB_0011db41;
    }
  }
  else {
    __first._M_current = __last._M_current;
    if (lVar16 != 3) goto LAB_0011db9f;
    __first._M_current = (shared_ptr<Component> *)p_Var23;
    if (((__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *)&p_Var23->_M_ptr)->_M_ptr->
        component_type != kComponentTypeDummy) {
      p_Var23 = p_Var23 + 1;
      goto LAB_0011db34;
    }
  }
LAB_0011db5e:
  p_Var23 = &(__first._M_current)->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>;
  if (__first._M_current != __last._M_current) {
    while (__first._M_current =
                (shared_ptr<Component> *)
                (&(__first._M_current)->super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> +
                1), __first._M_current != __last._M_current) {
      if (((__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *)__first._M_current)->_M_ptr->
          component_type != kComponentTypeDummy) {
        std::__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>::operator=
                  (p_Var23,(__shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2> *)__first._M_current
                  );
        p_Var23 = p_Var23 + 1;
      }
    }
    __last._M_current =
         (this->components_).
         super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    __first._M_current = (shared_ptr<Component> *)p_Var23;
  }
LAB_0011db9f:
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::erase
            (this_00,__first,__last);
  std::vector<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>::push_back
            (this_00,&comp_dummy);
  std::vector<BRDPart,_std::allocator<BRDPart>_>::~vector
            ((vector<BRDPart,_std::allocator<BRDPart>_> *)&net);
  std::_Vector_base<BRDPin,_std::allocator<BRDPin>_>::~_Vector_base
            ((_Vector_base<BRDPin,_std::allocator<BRDPin>_> *)&net_nc);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&comp_dummy.super___shared_ptr<Component,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  for (p_Var13 = net_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      (_Rb_tree_header *)p_Var13 != &net_map._M_t._M_impl.super__Rb_tree_header;
      p_Var13 = (_Base_ptr)std::_Rb_tree_increment(p_Var13)) {
    __x = p_Var13 + 2;
    bVar8 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            (*(long *)(p_Var13 + 2) + 0x10),"GND");
    bVar9 = true;
    if (!bVar8) {
      bVar9 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              (*(long *)__x + 0x10),"GROUND");
    }
    *(bool *)(*(long *)__x + 0x30) = bVar9;
    std::vector<std::shared_ptr<Net>,_std::allocator<std::shared_ptr<Net>_>_>::push_back
              (&this->nets_,(value_type *)__x);
  }
  psVar4 = (this->components_).
           super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
           ._M_impl.super__Vector_impl_data._M_start;
  psVar5 = (this->components_).
           super__Vector_base<std::shared_ptr<Component>,_std::allocator<std::shared_ptr<Component>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (psVar4 != psVar5) {
    uVar18 = (long)psVar5 - (long)psVar4 >> 4;
    lVar16 = 0x3f;
    if (uVar18 != 0) {
      for (; uVar18 >> lVar16 == 0; lVar16 = lVar16 + -1) {
      }
    }
    std::
    __introsort_loop<__gnu_cxx::__normal_iterator<std::shared_ptr<Component>*,std::vector<std::shared_ptr<Component>,std::allocator<std::shared_ptr<Component>>>>,long,__gnu_cxx::__ops::_Iter_comp_iter<BRDBoard::BRDBoard(BRDFileBase_const*)::__2>>
              (psVar4,psVar5,((uint)lVar16 ^ 0x3f) * 2 ^ 0x7e);
    if ((long)psVar5 - (long)psVar4 < 0x101) {
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<Component>*,std::vector<std::shared_ptr<Component>,std::allocator<std::shared_ptr<Component>>>>,__gnu_cxx::__ops::_Iter_comp_iter<BRDBoard::BRDBoard(BRDFileBase_const*)::__2>>
                (psVar4,psVar5);
    }
    else {
      psVar24 = psVar4 + 0x10;
      std::
      __insertion_sort<__gnu_cxx::__normal_iterator<std::shared_ptr<Component>*,std::vector<std::shared_ptr<Component>,std::allocator<std::shared_ptr<Component>>>>,__gnu_cxx::__ops::_Iter_comp_iter<BRDBoard::BRDBoard(BRDFileBase_const*)::__2>>
                (psVar4,psVar24);
      for (; psVar24 != psVar5; psVar24 = psVar24 + 1) {
        std::
        __unguarded_linear_insert<__gnu_cxx::__normal_iterator<std::shared_ptr<Component>*,std::vector<std::shared_ptr<Component>,std::allocator<std::shared_ptr<Component>>>>,__gnu_cxx::__ops::_Val_comp_iter<BRDBoard::BRDBoard(BRDFileBase_const*)::__2>>
                  (psVar24);
      }
    }
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::shared_ptr<Net>_>_>_>
  ::~_Rb_tree(&net_map._M_t);
  std::_Vector_base<BRDPoint,_std::allocator<BRDPoint>_>::~_Vector_base
            (&m_points.super__Vector_base<BRDPoint,_std::allocator<BRDPoint>_>);
  std::_Vector_base<BRDNail,_std::allocator<BRDNail>_>::~_Vector_base
            (&m_nails.super__Vector_base<BRDNail,_std::allocator<BRDNail>_>);
  std::_Vector_base<BRDPin,_std::allocator<BRDPin>_>::~_Vector_base
            (&m_pins.super__Vector_base<BRDPin,_std::allocator<BRDPin>_>);
  std::vector<BRDPart,_std::allocator<BRDPart>_>::~vector(&m_parts);
  return;
}

Assistant:

BRDBoard::BRDBoard(const BRDFileBase * const boardFile)
    : m_file(boardFile) {
	// TODO: strip / trim all strings, especially those used as keys
	// TODO: just loop through original arrays?
	std::vector<BRDPart> m_parts(m_file->num_parts);
	std::vector<BRDPin> m_pins(m_file->num_pins);
	std::vector<BRDNail> m_nails(m_file->num_nails);
	std::vector<BRDPoint> m_points(m_file->num_format);

	m_parts  = m_file->parts;
	m_pins   = m_file->pins;
	m_nails  = m_file->nails;
	m_points = m_file->format;

	// Set outline
	{
		for (auto &brdPoint : m_points) {
			auto point = std::make_shared<Point>(brdPoint.x, brdPoint.y);
			outline_points_.push_back(point);
		}
	}

	outline_segments_.reserve(m_file->outline_segments.size());
	std::transform(m_file->outline_segments.begin(), m_file->outline_segments.end(), std::back_inserter(outline_segments_), [](const std::pair<BRDPoint, BRDPoint> &s) -> std::pair<Point, Point> {
		return {{s.first.x, s.first.y}, {s.second.x, s.second.y}};
	});

	// Populate map of unique nets
	SharedStringMap<Net> net_map;
	{
		// adding special net 'UNCONNECTED'
		auto net_nc           = std::make_shared<Net>();
		net_nc->name          = kNetUnconnectedPrefix;
		net_nc->is_ground     = false;
		net_map[net_nc->name] = net_nc;

		// handle all the others
		for (auto &brd_nail : m_nails) {
			auto net = std::make_shared<Net>();

			// copy NET name and number (probe)
			net->name = std::string(brd_nail.net);

			// avoid having multiple UNCONNECTED<XXX> references
			if (is_prefix(kNetUnconnectedPrefix, net->name)) continue;

			net->number    = brd_nail.probe;

			if (brd_nail.side == BRDPartMountingSide::Top) {
				net->board_side = kBoardSideTop;
			} else {
				net->board_side = kBoardSideBottom;
			}

			// so we can find nets later by name (making unique by name)
			net_map[net->name] = net;
		}
	}

	// Populate parts
	{
		for (auto &brd_part : m_parts) {
			auto comp = std::make_shared<Component>();

			comp->name    = std::string(brd_part.name);
			comp->mfgcode = std::move(brd_part.mfgcode);

			comp->p1 = {brd_part.p1.x, brd_part.p1.y};
			comp->p2 = {brd_part.p2.x, brd_part.p2.y};

			// is it some dummy component to indicate test pads?
			if (is_prefix(kComponentDummyName, comp->name)) comp->component_type = Component::kComponentTypeDummy;

			// check what side the board is on (sorcery?)
			if (brd_part.mounting_side == BRDPartMountingSide::Top) {
				comp->board_side = kBoardSideTop;
			} else if (brd_part.mounting_side == BRDPartMountingSide::Bottom) {
				comp->board_side = kBoardSideBottom;
			} else {
				comp->board_side = kBoardSideBoth;
			}

			comp->mount_type = (brd_part.part_type == BRDPartType::SMD) ? Component::kMountTypeSMD : Component::kMountTypeDIP;

			components_.push_back(comp);
		}
	}

	// Populate pins
	{
		// generate dummy component as reference
		auto comp_dummy            = std::make_shared<Component>();
		comp_dummy->name           = kComponentDummyName;
		comp_dummy->component_type = Component::kComponentTypeDummy;

		// NOTE: originally the pin diameter depended on part.name[0] == 'U' ?
		unsigned int pin_idx  = 0;
		unsigned int part_idx = 1;
		auto pins             = m_pins;
		auto parts            = m_parts;

		for (size_t i = 0; i < pins.size(); i++) {
			// (originally from BoardView::DrawPins)
			const BRDPin &brd_pin = pins[i];
			std::shared_ptr<Component> comp       = components_[brd_pin.part - 1];

			if (!comp) continue;

			auto pin = std::make_shared<Pin>();

			if (comp->is_dummy()) {
				// component is virtual, i.e. "...", pin is test pad
				pin->type      = Pin::kPinTypeTestPad;
				pin->component = comp_dummy;
				comp_dummy->pins.push_back(pin);
			} else {
				// component is regular / not virtual
				pin->type       = Pin::kPinTypeComponent;
				pin->component  = comp;
				comp->pins.push_back(pin);
			}

			// determine pin number on part
			++pin_idx;
			if (brd_pin.part != part_idx) {
				part_idx = brd_pin.part;
				pin_idx  = 1;
			}
			if (brd_pin.snum) {
				pin->number = brd_pin.snum;
			} else {
				pin->number = std::to_string(pin_idx);
			}

			// Lets us see BGA pad names finally
			//
			if (brd_pin.name) {
				pin->name = std::string(brd_pin.name);
			} else {
				pin->name = pin->number;
			}

			// copy position
			pin->position = Point(brd_pin.pos.x, brd_pin.pos.y);

			// Set board side for pins from specific setting
			if (brd_pin.side == BRDPinSide::Top) {
				pin->board_side = kBoardSideTop;
			} else if (brd_pin.side == BRDPinSide::Bottom) {
				pin->board_side = kBoardSideBottom;
			} else {
				pin->board_side = kBoardSideBoth;
			}

			// set net reference (here's our NET key string again)
			std::string net_name = std::string(brd_pin.net);
			if (net_map.count(net_name)) {
				// there is a net with that name in our map
				pin->net = net_map[net_name].get();
			} else {
				// no net with that name registered, so create one
				if (!net_name.empty()) {
					if (is_prefix(kNetUnconnectedPrefix, net_name)) {
						// pin is unconnected, so reference our special net
						pin->net  = net_map[kNetUnconnectedPrefix].get();
						pin->type = Pin::kPinTypeNotConnected;
					} else {
						// indeed a new net
						auto net        = std::make_shared<Net>();
						net->name       = net_name;
						net->board_side = pin->board_side;
						// NOTE: net->number not set
						net_map[net_name] = net;
						pin->net          = net.get();
					}
				} else {
					// not sure this can happen -> no info
					// It does happen in .fz apparently and produces a SEGFAULT… Use
					// unconnected net.
					pin->net  = net_map[kNetUnconnectedPrefix].get();
					pin->type = Pin::kPinTypeNotConnected;
				}
			}

			// TODO: should either depend on file specs or type etc
			//
			//  if(brd_pin.radius) pin->diameter = brd_pin.radius; // some format
			//  (.fz) contains a radius field
			//    else pin->diameter = 0.5f;
			pin->diameter = brd_pin.radius; // some format (.fz) contains a radius field

			pin->net->pins.push_back(pin);
			pins_.push_back(pin);
		}

		// remove all dummy components from vector, add our official dummy
		components_.erase(
		    remove_if(begin(components_), end(components_), [](std::shared_ptr<Component> &comp) { return comp->is_dummy(); }),
		    end(components_));

		components_.push_back(comp_dummy);
	}

	// Populate Net vector by using the map. (sorted by keys)
	for (auto &net : net_map) {
		// check whether the pin represents ground
		net.second->is_ground = (net.second->name == "GND" || net.second->name == "GROUND");
		nets_.push_back(net.second);
	}

	// Sort components by name
	sort(begin(components_), end(components_), [](const std::shared_ptr<Component> &lhs, const std::shared_ptr<Component> &rhs) {
		return lhs->name < rhs->name;
	});
}